

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::operator()
          (exhaustive_solver<baryonyx::itm::maximize_tag,double> *this,int k,
          vector<rc,_std::allocator<rc>_> *reduced_cost,int r_size)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *peVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  uint *puVar5;
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *peVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  __i;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong __new_size;
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *peVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  
  peVar1 = this + 0x50;
  peVar6 = peVar1;
  for (peVar16 = *(exhaustive_solver<baryonyx::itm::maximize_tag,double> **)(this + 0x58);
      peVar16 != (exhaustive_solver<baryonyx::itm::maximize_tag,double> *)0x0;
      peVar16 = *(exhaustive_solver<baryonyx::itm::maximize_tag,double> **)
                 (peVar16 + (ulong)(*(int *)(peVar16 + 0x20) < k) * 8 + 0x10)) {
    if (k <= *(int *)(peVar16 + 0x20)) {
      peVar6 = peVar16;
    }
  }
  peVar16 = peVar1;
  if ((peVar6 != peVar1) && (peVar16 = peVar6, k < *(int *)(peVar6 + 0x20))) {
    peVar16 = peVar1;
  }
  if (peVar16 == peVar1) {
    operator()();
  }
  __new_size = (ulong)(uint)r_size;
  std::
  vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
            *)this,__new_size);
  if (r_size != 0) {
    lVar4 = *(long *)this;
    piVar3 = &((reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
               super__Vector_impl_data._M_start)->f;
    lVar10 = 0;
    do {
      *(double *)(lVar4 + lVar10) = ((rc *)(piVar3 + -3))->value;
      *(int *)(lVar4 + 0xc + lVar10) = piVar3[-1];
      *(int *)(lVar4 + 8 + lVar10) = *piVar3;
      *(undefined4 *)(lVar4 + 0x10 + lVar10) = 0;
      piVar3 = piVar3 + 4;
      lVar10 = lVar10 + 0x18;
    } while (__new_size * 0x18 != lVar10);
  }
  lVar4 = (long)*(int *)(peVar16 + 0x24);
  if (r_size == 0) {
    auVar17 = ZEXT1664(ZEXT816(0));
  }
  else {
    auVar17 = ZEXT1664(ZEXT816(0));
    lVar10 = 0;
    do {
      if (*(int *)(lVar4 * 4 + *(long *)(this + 0x18) + lVar10) != 0) {
        auVar17 = ZEXT864((ulong)(auVar17._0_8_ +
                                 *(double *)
                                  ((long)&((reduced_cost->
                                           super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
                                           super__Vector_impl_data._M_start)->value + lVar10 * 4)));
      }
      lVar10 = lVar10 + 4;
    } while (__new_size * 4 - lVar10 != 0);
  }
  iVar7 = 0;
  if ((ulong)*(uint *)(peVar16 + 0x28) != 1) {
    lVar10 = lVar4 * 4 + (long)r_size * 4 + *(long *)(this + 0x18);
    uVar8 = 0;
    uVar14 = 1;
    do {
      auVar19 = ZEXT864(0) << 0x40;
      auVar18 = auVar19._0_16_;
      if (r_size != 0) {
        lVar15 = 0;
        do {
          if (*(int *)(lVar10 + lVar15) != 0) {
            auVar19 = ZEXT864((ulong)(auVar19._0_8_ +
                                     *(double *)
                                      ((long)&((reduced_cost->
                                               super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
                                               super__Vector_impl_data._M_start)->value + lVar15 * 4
                                      )));
          }
          auVar18 = auVar19._0_16_;
          lVar15 = lVar15 + 4;
        } while (__new_size * 4 - lVar15 != 0);
      }
      if (auVar17._0_8_ < auVar18._0_8_) {
        uVar8 = uVar14 & 0xffffffff;
      }
      iVar7 = (int)uVar8;
      auVar18 = vmaxsd_avx(auVar18,auVar17._0_16_);
      auVar17 = ZEXT1664(auVar18);
      uVar14 = uVar14 + 1;
      lVar10 = lVar10 + (long)r_size * 4;
    } while (uVar14 != *(uint *)(peVar16 + 0x28));
  }
  if (r_size != 0) {
    lVar10 = *(long *)(this + 0x18);
    puVar5 = (uint *)(*(long *)this + 0x10);
    uVar8 = 0;
    do {
      *puVar5 = (uint)(*(int *)((iVar7 * r_size + lVar4) * 4 + lVar10 + uVar8 * 4) != 0);
      uVar8 = uVar8 + 1;
      puVar5 = puVar5 + 6;
    } while (__new_size != uVar8);
  }
  lVar4 = *(long *)this;
  lVar10 = *(long *)(this + 8);
  if (lVar4 != lVar10) {
    std::operator()(lVar4,lVar10,
                    (int)LZCOUNT((lVar10 - lVar4 >> 3) * -0x5555555555555555) * 2 ^ 0x7e);
    if (lVar10 - lVar4 < 0x181) {
      std::operator()(lVar4,lVar10);
    }
    else {
      lVar15 = lVar4 + 0x180;
      std::operator()(lVar4,lVar15);
      for (; lVar15 != lVar10; lVar15 = lVar15 + 0x18) {
        std::operator()(lVar15);
      }
    }
  }
  lVar4 = *(long *)this;
  lVar10 = *(long *)(this + 8);
  lVar9 = (lVar10 - lVar4 >> 3) * -0x5555555555555555;
  lVar13 = lVar9 >> 2;
  lVar15 = lVar4;
  if (0 < lVar13) {
    lVar15 = lVar13 * 0x60 + lVar4;
    lVar13 = lVar13 + 1;
    lVar11 = lVar4 + 0x30;
    do {
      if (*(int *)(lVar11 + -0x20) == 0) {
        lVar11 = lVar11 + -0x30;
        goto LAB_00107cad;
      }
      if (*(int *)(lVar11 + -8) == 0) {
        lVar11 = lVar11 + -0x18;
        goto LAB_00107cad;
      }
      if (*(int *)(lVar11 + 0x10) == 0) goto LAB_00107cad;
      if (*(int *)(lVar11 + 0x28) == 0) {
        lVar11 = lVar11 + 0x18;
        goto LAB_00107cad;
      }
      lVar13 = lVar13 + -1;
      lVar11 = lVar11 + 0x60;
    } while (1 < lVar13);
  }
  lVar13 = (lVar10 - lVar15 >> 3) * -0x5555555555555555;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      lVar11 = lVar10;
      if ((lVar13 != 3) || (lVar11 = lVar15, *(int *)(lVar15 + 0x10) == 0)) goto LAB_00107cad;
      lVar15 = lVar15 + 0x18;
    }
    lVar11 = lVar15;
    if (*(int *)(lVar15 + 0x10) == 0) goto LAB_00107cad;
    lVar15 = lVar15 + 0x18;
  }
  lVar11 = lVar15;
  if (*(int *)(lVar15 + 0x10) != 0) {
    lVar11 = lVar10;
  }
LAB_00107cad:
  if (lVar10 != lVar4) {
    piVar3 = (int *)(lVar4 + 0xc);
    piVar12 = &((reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
                super__Vector_impl_data._M_start)->f;
    do {
      ((rc *)(piVar12 + -3))->value = *(double *)(piVar3 + -3);
      piVar12[-1] = *piVar3;
      *piVar12 = piVar3[-1];
      piVar3 = piVar3 + 6;
      piVar12 = piVar12 + 4;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  if (lVar11 == lVar10) {
    uVar2 = -(uint)(*(int *)(lVar4 + 0x10) == 0) | r_size;
  }
  else {
    uVar2 = (int)((ulong)(lVar11 - lVar4) >> 3) * -0x55555555 - 1;
  }
  return uVar2;
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }